

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                 (RepeatedField<int> *value,size_t tag_size,CachedSize *cached_size)

{
  bool bVar1;
  int iVar2;
  const_pointer data;
  size_t size;
  size_t sVar3;
  size_t res;
  CachedSize *cached_size_local;
  size_t tag_size_local;
  RepeatedField<int> *value_local;
  
  bVar1 = RepeatedField<int>::empty(value);
  if (bVar1) {
    CachedSize::Set(cached_size,0);
    value_local = (RepeatedField<int> *)0x0;
  }
  else {
    data = RepeatedField<int>::data(value);
    iVar2 = RepeatedField<int>::size(value);
    size = VarintSize<false,true,int>(data,iVar2);
    iVar2 = ToCachedSize(size);
    CachedSize::SetNonZero(cached_size,iVar2);
    sVar3 = Int32Size((int32_t)size);
    value_local = (RepeatedField<int> *)(tag_size + size + sVar3);
  }
  return (size_t)value_local;
}

Assistant:

size_t WireFormatLite::Int32SizeWithPackedTagSize(
    const RepeatedField<int32_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = Int32Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}